

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lca_test.cpp
# Opt level: O0

void __thiscall
LCA_BenchmarkN100000Q100000_Test::~LCA_BenchmarkN100000Q100000_Test
          (LCA_BenchmarkN100000Q100000_Test *this)

{
  LCA_BenchmarkN100000Q100000_Test *this_local;
  
  ~LCA_BenchmarkN100000Q100000_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(LCA, BenchmarkN100000Q100000) {
    srand(1);
    int n = 100000;
    int q = 100000;
    generateTree(n);
    initLCA(0, n);
    rep(i, 0, q) {
        lca(rand() % n, rand() % n);
    }
}